

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O1

void __thiscall StunMsg_BasicBindingRequest_Test::TestBody(StunMsg_BasicBindingRequest_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  uint8_t expected_result [20];
  uint8_t tsx_id [12];
  uint8_t buffer [20];
  AssertHelper local_98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_80;
  AssertHelper local_60;
  stun_msg_hdr local_58;
  uint8_t local_38 [16];
  stun_msg_hdr local_28;
  
  local_58.type = 0x100;
  local_58.length = 0;
  local_58.magic = 0x42a41221;
  local_58.tsx_id[0] = 0xfd;
  local_58.tsx_id[1] = 0x95;
  local_58.tsx_id[2] = 0xe8;
  local_58.tsx_id[3] = 0x83;
  local_58.tsx_id[4] = 0x8a;
  local_58.tsx_id[5] = '\x05';
  local_58.tsx_id[6] = '(';
  local_58.tsx_id[7] = 'E';
  local_58.tsx_id[8] = 'j';
  local_58.tsx_id[9] = 0x8e;
  local_58.tsx_id[10] = 0xf1;
  local_58.tsx_id[0xb] = 0xe2;
  local_38[8] = 'j';
  local_38[9] = 0x8e;
  local_38[10] = 0xf1;
  local_38[0xb] = 0xe2;
  local_38[0] = 0xfd;
  local_38[1] = 0x95;
  local_38[2] = 0xe8;
  local_38[3] = 0x83;
  local_38[4] = 0x8a;
  local_38[5] = '\x05';
  local_38[6] = '(';
  local_38[7] = 'E';
  local_90.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000014;
  local_98.data_ = (AssertHelperData *)&DAT_00000014;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&local_90,(unsigned_long *)&local_98);
  if ((char)local_80._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_80._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90.ptr_ + 8))();
      }
      local_90.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_80._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_90.ptr_._0_4_ = 1;
    iVar3 = stun_msg_verify(&local_58,0x14);
    local_98.data_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_80,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&local_90,(int *)&local_98);
    if ((char)local_80._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_90);
      if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_80._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x5e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_90.ptr_ + 8))();
        }
        local_90.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      stun_msg_hdr_init(&local_28,1,local_38);
      anon_unknown.dwarf_9b63::IsEqual
                ((anon_unknown_dwarf_9b63 *)&local_90,&local_58,&local_28,0x14);
      if (local_90.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_80,(internal *)&local_90,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,100,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                         (char)local_80._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p) !=
            &local_80.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_80._M_dataplus._M_p._1_7_,(char)local_80._M_dataplus._M_p),
                          local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_98.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_98.data_ + 8))();
          }
          local_98.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.ptr_._0_4_ = 1;
      uVar2 = stun_msg_type(&local_58);
      local_98.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&local_80,"STUN_BINDING_REQUEST","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&local_90,(unsigned_short *)&local_98);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x68,pcVar4);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000014;
      local_98.data_ = (AssertHelperData *)stun_msg_len(&local_58);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_80,"sizeof(stun_msg_hdr)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&local_90,(unsigned_long *)&local_98);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x69,pcVar4);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           stun_msg_next_attr(&local_58,(stun_attr_hdr *)0x0);
      local_98.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperEQ<_stun_attr_hdr_const*,_stun_attr_hdr_const*>
                ((internal *)&local_80,"__null","attr_hdr",(_stun_attr_hdr **)&local_98,
                 (_stun_attr_hdr **)&local_90);
      if ((char)local_80._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_90);
        if ((undefined8 *)local_80._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_80._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x6c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if ((stun_attr_hdr *)local_90.ptr_ != (stun_attr_hdr *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((stun_attr_hdr *)local_90.ptr_ != (stun_attr_hdr *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST(StunMsg, BasicBindingRequest) {
  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x00, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xfd,0x95,0xe8,0x83, // }
    0x8a,0x05,0x28,0x45, // }  Transaction ID
    0x6a,0x8e,0xf1,0xe2  // }
  };
  
  uint8_t buffer[sizeof(stun_msg_hdr)];

  uint8_t tsx_id[12] = {
    0xfd,0x95,0xe8,0x83,
    0x8a,0x05,0x28,0x45,
    0x6a,0x8e,0xf1,0xe2
  };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_REQUEST, tsx_id);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_REQUEST, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(stun_msg_hdr), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(NULL, attr_hdr);
}